

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_bin.c
# Opt level: O2

void duckdb_je_cache_bin_preincrement
               (cache_bin_info_t *infos,szind_t ninfos,void *alloc,size_t *cur_offset)

{
  *(undefined8 *)((long)alloc + *cur_offset) = 0x7a7a7a7a7a7a7a7a;
  *cur_offset = *cur_offset + 8;
  return;
}

Assistant:

void
cache_bin_preincrement(const cache_bin_info_t *infos, szind_t ninfos, void *alloc,
    size_t *cur_offset) {
	if (config_debug) {
		size_t computed_size;
		size_t computed_alignment;

		/* Pointer should be as aligned as we asked for. */
		cache_bin_info_compute_alloc(infos, ninfos, &computed_size,
		    &computed_alignment);
		assert(((uintptr_t)alloc & (computed_alignment - 1)) == 0);
	}

	*(uintptr_t *)((byte_t *)alloc + *cur_offset) =
	    cache_bin_preceding_junk;
	*cur_offset += sizeof(void *);
}